

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::PrintGeneratorList(cmake *this)

{
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_c8;
  cmDocumentation local_b0;
  
  cmDocumentation::cmDocumentation(&local_b0);
  local_c8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetGeneratorDocumentation(this,&local_c8);
  cmDocumentation::AppendSection(&local_b0,"Generators",&local_c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  cmDocumentation::PrintDocumentation(&local_b0,ListGenerators,(ostream *)&std::cerr);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_c8);
  cmDocumentation::~cmDocumentation(&local_b0);
  return;
}

Assistant:

void cmake::PrintGeneratorList()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  std::vector<cmDocumentationEntry> generators;
  this->GetGeneratorDocumentation(generators);
  doc.AppendSection("Generators", generators);
  std::cerr << "\n";
  doc.PrintDocumentation(cmDocumentation::ListGenerators, std::cerr);
#endif
}